

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::reportBasisData(Basis *this)

{
  double dVar1;
  
  puts("\nBasis data");
  printf("    Num factorizations = %d\n",(ulong)(uint)this->num_factorizations_);
  printf("    Num updates = %d\n",(ulong)(uint)this->num_updates_);
  if (this->num_ftran_ != 0) {
    dVar1 = (double)this->num_ftran_;
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
           this->sum_ftran_density_ / dVar1,(double)this->num_ftran_sparse_ / dVar1);
  }
  if (this->num_btran_ != 0) {
    dVar1 = (double)this->num_btran_;
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
           this->sum_btran_density_ / dVar1,(double)this->num_btran_sparse_ / dVar1);
  }
  mean_fill(this);
  printf("    Mean fill-in %11.4g\n");
  max_fill(this);
  printf("    Max  fill-in %11.4g\n");
  return;
}

Assistant:

void Basis::reportBasisData() const {
  printf("\nBasis data\n");
  printf("    Num factorizations = %d\n", (int)this->factorizations());
  printf("    Num updates = %d\n", (int)updates_total());
  if (this->num_ftran_) 
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_ftran_, this->sum_ftran_density_ / this->num_ftran_, frac_ftran_sparse());
  if (this->num_btran_) 
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_btran_, this->sum_btran_density_ / this->num_btran_, frac_btran_sparse());
  printf("    Mean fill-in %11.4g\n", mean_fill());
  printf("    Max  fill-in %11.4g\n", max_fill());

}